

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O3

void __thiscall HighsSparseMatrix::scaleCol(HighsSparseMatrix *this,HighsInt col,double colScale)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer pdVar4;
  pointer piVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  
  if (this->format_ == kColwise) {
    piVar3 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar1 = piVar3[col];
    lVar6 = (long)iVar1;
    iVar8 = piVar3[(long)col + 1];
    if (iVar1 < iVar8) {
      pdVar4 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        pdVar4[lVar6] = pdVar4[lVar6] * colScale;
        lVar6 = lVar6 + 1;
      } while (iVar8 != lVar6);
    }
  }
  else {
    iVar1 = this->num_row_;
    if (0 < (long)iVar1) {
      piVar3 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar5 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = 0;
      iVar8 = *piVar3;
      do {
        iVar2 = piVar3[lVar6 + 1];
        if (iVar8 < iVar2) {
          pdVar4 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar7 = (long)iVar8;
          do {
            if (piVar5[lVar7] == col) {
              pdVar4[lVar7] = pdVar4[lVar7] * colScale;
            }
            lVar7 = lVar7 + 1;
          } while (iVar2 != lVar7);
        }
        lVar6 = lVar6 + 1;
        iVar8 = iVar2;
      } while (lVar6 != iVar1);
    }
  }
  return;
}

Assistant:

bool HighsSparseMatrix::isColwise() const {
  return this->format_ == MatrixFormat::kColwise;
}